

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall cmGeneratorTarget::GetExportMacro_abi_cxx11_(cmGeneratorTarget *this)

{
  bool bVar1;
  TargetType TVar2;
  cmValue cVar3;
  string *psVar4;
  string in;
  cmAlphaNum local_90;
  string local_60;
  cmAlphaNum local_40;
  
  TVar2 = GetType(this);
  if (((TVar2 != SHARED_LIBRARY) && (TVar2 = GetType(this), TVar2 != MODULE_LIBRARY)) &&
     (bVar1 = IsExecutableWithExports(this), !bVar1)) {
    return (string *)0x0;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"DEFINE_SYMBOL",(allocator<char> *)&local_40);
  cVar3 = GetProperty(this,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  if (cVar3.Value == (string *)0x0) {
    psVar4 = GetName_abi_cxx11_(this);
    local_90.View_._M_str = (psVar4->_M_dataplus)._M_p;
    local_90.View_._M_len = psVar4->_M_string_length;
    local_40.View_._M_len = 8;
    local_40.View_._M_str = "_EXPORTS";
    cmStrCat<>(&local_60,&local_90,&local_40);
    cmsys::SystemTools::MakeCidentifier((string *)&local_90,&local_60);
    std::__cxx11::string::operator=((string *)&this->ExportMacro,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&this->ExportMacro);
  }
  return &this->ExportMacro;
}

Assistant:

const std::string* cmGeneratorTarget::GetExportMacro() const
{
  // Define the symbol for targets that export symbols.
  if (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
      this->GetType() == cmStateEnums::MODULE_LIBRARY ||
      this->IsExecutableWithExports()) {
    if (cmValue custom_export_name = this->GetProperty("DEFINE_SYMBOL")) {
      this->ExportMacro = *custom_export_name;
    } else {
      std::string in = cmStrCat(this->GetName(), "_EXPORTS");
      this->ExportMacro = cmSystemTools::MakeCidentifier(in);
    }
    return &this->ExportMacro;
  }
  return nullptr;
}